

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# memory_tree.cc
# Opt level: O2

void memory_tree_ns::predict(memory_tree *b,single_learner *base,example *ec)

{
  polylabel *ppVar1;
  polyprediction *ppVar2;
  int iVar3;
  uint32_t uVar4;
  node *pnVar5;
  int64_t iVar6;
  ulong uVar7;
  float fVar8;
  labels preds;
  labels multilabels;
  v_array<unsigned_int> selected_labs;
  float local_ac;
  label_t local_a0;
  float *local_98;
  float *pfStack_90;
  float *local_88;
  size_t sStack_80;
  label_t local_78;
  wclass *pwStack_70;
  wclass *local_68;
  size_t sStack_60;
  v_array<unsigned_int> local_58;
  
  ppVar1 = &ec->l;
  ppVar2 = &ec->pred;
  if (b->oas == 0) {
    local_a0 = ppVar1->multi;
    local_ac = ppVar2->scalar;
  }
  else {
    local_78 = ppVar1->multi;
    pwStack_70 = (ec->l).cs.costs._end;
    local_68 = (ec->l).cs.costs.end_array;
    sStack_60 = (ec->l).cs.costs.erase_count;
    local_98 = (ppVar2->scalars)._begin;
    pfStack_90 = (ec->pred).scalars._end;
    local_88 = (ec->pred).scalars.end_array;
    sStack_80 = (ec->pred).scalars.erase_count;
    local_ac = 0.0;
  }
  (ec->l).cs.costs._begin = (wclass *)0x3f800000bf800000;
  (ec->l).simple.initial = 0.0;
  pnVar5 = (b->nodes)._begin;
  for (uVar7 = 0; pnVar5[uVar7].internal == 1;
      uVar7 = (ulong)(&pnVar5[uVar7].left)[0.0 < (ec->pred).scalar || (ec->pred).scalar == 0.0]) {
    LEARNER::learner<char,_example>::predict(base,ec,(ulong)pnVar5[uVar7].base_router);
    pnVar5 = (b->nodes)._begin;
  }
  if (b->oas == 0) {
    ppVar1->multi = local_a0;
    ppVar2->scalar = local_ac;
  }
  else {
    (ec->pred).scalars.end_array = local_88;
    (ec->pred).scalars.erase_count = sStack_80;
    (ppVar2->scalars)._begin = local_98;
    (ec->pred).scalars._end = pfStack_90;
    (ec->l).cs.costs.end_array = local_68;
    (ec->l).cs.costs.erase_count = sStack_60;
    ppVar1->multi = local_78;
    (ec->l).cs.costs._end = pwStack_70;
  }
  iVar3 = b->oas;
  iVar6 = pick_nearest(b,base,(uint32_t)uVar7,ec);
  if (iVar3 == 0) {
    if (iVar6 == -1) {
      uVar4 = 0;
    }
    else {
      uVar4 = ((b->examples)._begin[iVar6]->l).multi.label;
    }
    ppVar2->multiclass = uVar4;
    if ((ppVar1->multi).label != uVar4) {
      ec->loss = ec->weight;
      b->num_mistakes = b->num_mistakes + 1;
    }
  }
  else {
    if (iVar6 != -1) {
      fVar8 = F1_score_for_two_examples(ec,(b->examples)._begin[iVar6]);
      b->F1_score = fVar8 + b->F1_score;
    }
    local_58.end_array = (uint *)0x0;
    local_58.erase_count = 0;
    local_58._begin = (uint *)0x0;
    local_58._end = (uint *)0x0;
    uVar4 = compute_hamming_loss_via_oas(b,base,(uint32_t)uVar7,ec,&local_58);
    ec->loss = (float)uVar4;
    b->hamming_loss = (float)uVar4 + b->hamming_loss;
  }
  return;
}

Assistant:

void predict(memory_tree& b, single_learner& base, example& ec)
    {  
        MULTICLASS::label_t mc;
        uint32_t save_multi_pred = 0;
        MULTILABEL::labels multilabels;
        MULTILABEL::labels preds;
        if (b.oas == false){
            mc = ec.l.multi;
            save_multi_pred = ec.pred.multiclass;
        }
        else{
            multilabels = ec.l.multilabels;
            preds = ec.pred.multilabels;
        }


        uint32_t cn = 0;
        ec.l.simple = {-1.f, 1.f, 0.};
        while(b.nodes[cn].internal == 1){ //if it's internal{
            base.predict(ec, b.nodes[cn].base_router);
            uint32_t newcn = ec.pred.scalar < 0 ? b.nodes[cn].left : b.nodes[cn].right; //do not need to increment nl and nr.
            cn = newcn;
        }
        
        if(b.oas == false){
            ec.l.multi = mc; 
            ec.pred.multiclass = save_multi_pred;
        }
        else{
            ec.pred.multilabels = preds; 
            ec.l.multilabels = multilabels;
        }

        int64_t closest_ec = 0;
        if(b.oas == false){
            closest_ec = pick_nearest(b, base, cn, ec);
            if (closest_ec != -1)
                ec.pred.multiclass = b.examples[closest_ec]->l.multi.label;
            else
                ec.pred.multiclass = 0;
            
            if (ec.l.multi.label != ec.pred.multiclass){
                ec.loss = ec.weight;
                b.num_mistakes++;
            }
        }
        else{
            float reward = 0.f;
            closest_ec = pick_nearest(b, base, cn, ec); 
            if (closest_ec != -1){
                reward = F1_score_for_two_examples(ec, *b.examples[closest_ec]);
                b.F1_score += reward;
            }
            v_array<uint32_t> selected_labs = v_init<uint32_t>();
            ec.loss = compute_hamming_loss_via_oas(b, base, cn, ec, selected_labs);
            b.hamming_loss += ec.loss;
        }
    }